

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

void __thiscall
ValidationCache::ValidationCache
          (ValidationCache *this,size_t script_execution_cache_bytes,size_t signature_cache_bytes)

{
  long lVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  Span<unsigned_char> bytes;
  string_view logging_function;
  string_view source_file;
  ulong local_78;
  ulong local_70;
  uint32_t local_68 [2];
  long local_60;
  uint256 nonce;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CSHA256::CSHA256(&this->m_script_execution_cache_hasher);
  CuckooCache::cache<uint256,_SignatureCacheHasher>::cache(&this->m_script_execution_cache);
  SignatureCache::SignatureCache(&this->m_signature_cache,signature_cache_bytes);
  nonce.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  nonce.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  bytes.m_size = 0x20;
  bytes.m_data = (uchar *)&nonce;
  GetRandBytes(bytes);
  CSHA256::Write(&this->m_script_execution_cache_hasher,(uchar *)&nonce,0x20);
  CSHA256::Write(&this->m_script_execution_cache_hasher,(uchar *)&nonce,0x20);
  uVar2 = script_execution_cache_bytes >> 5;
  if (0xfffffffe < uVar2) {
    uVar2 = 0xffffffff;
  }
  local_68[0] = CuckooCache::cache<uint256,_SignatureCacheHasher>::setup
                          (&this->m_script_execution_cache,(uint32_t)uVar2);
  local_60 = (ulong)local_68[0] << 5;
  local_70 = (ulong)(local_68[0] >> 0xf);
  local_78 = script_execution_cache_bytes >> 0x14;
  logging_function._M_str = "ValidationCache";
  logging_function._M_len = 0xf;
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
  ;
  source_file._M_len = 0x5e;
  LogPrintFormatInternal<unsigned_long,unsigned_long,unsigned_int>
            (logging_function,source_file,0x83c,ALL,Info,(ConstevalFormatString<3U>)0x821539,
             &local_70,&local_78,local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ValidationCache::ValidationCache(const size_t script_execution_cache_bytes, const size_t signature_cache_bytes)
    : m_signature_cache{signature_cache_bytes}
{
    // Setup the salted hasher
    uint256 nonce = GetRandHash();
    // We want the nonce to be 64 bytes long to force the hasher to process
    // this chunk, which makes later hash computations more efficient. We
    // just write our 32-byte entropy twice to fill the 64 bytes.
    m_script_execution_cache_hasher.Write(nonce.begin(), 32);
    m_script_execution_cache_hasher.Write(nonce.begin(), 32);

    const auto [num_elems, approx_size_bytes] = m_script_execution_cache.setup_bytes(script_execution_cache_bytes);
    LogPrintf("Using %zu MiB out of %zu MiB requested for script execution cache, able to store %zu elements\n",
              approx_size_bytes >> 20, script_execution_cache_bytes >> 20, num_elems);
}